

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O1

bool boost::operator==(dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *a,
                      dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b)

{
  pointer __s1;
  pointer puVar1;
  pointer __s2;
  int iVar2;
  size_t __n;
  
  if (a->m_num_bits == b->m_num_bits) {
    __s1 = (a->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
    puVar1 = (a->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __n = (long)puVar1 - (long)__s1;
    __s2 = (b->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
    if (__n == (long)(b->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)__s2) {
      if (puVar1 != __s1) {
        iVar2 = bcmp(__s1,__s2,__n);
        return iVar2 == 0;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool operator==(const dynamic_bitset<Block, Allocator>& a,
                const dynamic_bitset<Block, Allocator>& b)
{
    return (a.m_num_bits == b.m_num_bits)
           && (a.m_bits == b.m_bits);
}